

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O3

lysc_pattern ** lysc_patterns_dup(ly_ctx *ctx,lysc_pattern **orig)

{
  undefined1 *puVar1;
  lysc_pattern *plVar2;
  ulong *puVar3;
  lysc_pattern *plVar4;
  lysc_pattern **pplVar5;
  
  plVar4 = orig[-1];
  puVar3 = (ulong *)calloc(1,(long)plVar4 * 8 + 8);
  if (puVar3 == (ulong *)0x0) {
    pplVar5 = (lysc_pattern **)0x0;
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysc_patterns_dup");
  }
  else {
    pplVar5 = (lysc_pattern **)(puVar3 + 1);
    if (plVar4 != (lysc_pattern *)0x0) {
      plVar4 = (lysc_pattern *)0x0;
      do {
        plVar2 = orig[(long)plVar4];
        puVar1 = &plVar2->field_0x38;
        *(int *)puVar1 = *(int *)puVar1 + 2;
        puVar3[(long)((long)&plVar4->expr + 1)] = (ulong)plVar2;
        plVar4 = (lysc_pattern *)((long)&plVar4->expr + 1);
      } while (plVar4 < orig[-1]);
      *puVar3 = (ulong)plVar4;
    }
  }
  return pplVar5;
}

Assistant:

static struct lysc_pattern **
lysc_patterns_dup(struct ly_ctx *ctx, struct lysc_pattern **orig)
{
    struct lysc_pattern **dup = NULL;
    LY_ARRAY_COUNT_TYPE u;

    assert(orig);

    LY_ARRAY_CREATE_RET(ctx, dup, LY_ARRAY_COUNT(orig), NULL);
    LY_ARRAY_FOR(orig, u) {
        dup[u] = lysc_pattern_dup(orig[u]);
        LY_ARRAY_INCREMENT(dup);
    }
    return dup;
}